

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseErrorTest_ReservedMissingQuotes_Test::TestBody
          (ParseErrorTest_ReservedMissingQuotes_Test *this)

{
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_38
  ;
  string_view local_20;
  ParseErrorTest_ReservedMissingQuotes_Test *local_10;
  ParseErrorTest_ReservedMissingQuotes_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,"message Foo {\n  reserved foo;\n}\n");
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_38,
            "1:11: Reserved names must be string literals. (Only editions supports identifiers.)\n")
  ;
  ParserTest::ExpectHasErrors(&this->super_ParseErrorTest,local_20,&local_38);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_38);
  return;
}

Assistant:

TEST_F(ParseErrorTest, ReservedMissingQuotes) {
  ExpectHasErrors(
      "message Foo {\n"
      "  reserved foo;\n"
      "}\n",
      "1:11: Reserved names must be string literals. (Only editions supports "
      "identifiers.)\n");
}